

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O3

void mean_double_4_suite::test_same(void)

{
  moment<double,_4> filter;
  value_type local_80;
  ulong local_78;
  basic_moment<double,_4UL,_(trial::online::with)1> local_70;
  
  local_70.member.window.super_span<double,_4UL>.member.size = 0;
  local_70.member.window.super_span<double,_4UL>.member.next = 4;
  local_70.member.mean = 0.0;
  local_70.member.window.super_span<double,_4UL>.member.data = (pointer)&local_70;
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,1.0);
  local_80 = (value_type)local_70.member.window.super_span<double,_4UL>.member.size;
  local_78 = CONCAT44(local_78._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xe0,"void mean_double_4_suite::test_same()",&local_80,&local_78);
  local_80 = local_70.member.mean;
  local_78 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xe1,"void mean_double_4_suite::test_same()",&local_80,&local_78);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,1.0);
  local_80 = (value_type)local_70.member.window.super_span<double,_4UL>.member.size;
  local_78 = CONCAT44(local_78._4_4_,2);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xe3,"void mean_double_4_suite::test_same()",&local_80,&local_78);
  local_80 = local_70.member.mean;
  local_78 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xe4,"void mean_double_4_suite::test_same()",&local_80,&local_78);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,1.0);
  local_80 = (value_type)local_70.member.window.super_span<double,_4UL>.member.size;
  local_78 = CONCAT44(local_78._4_4_,3);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xe6,"void mean_double_4_suite::test_same()",&local_80,&local_78);
  local_80 = local_70.member.mean;
  local_78 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xe7,"void mean_double_4_suite::test_same()",&local_80,&local_78);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,1.0);
  local_80 = (value_type)local_70.member.window.super_span<double,_4UL>.member.size;
  local_78 = CONCAT44(local_78._4_4_,4);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xe9,"void mean_double_4_suite::test_same()",&local_80,&local_78);
  local_80 = local_70.member.mean;
  local_78 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xea,"void mean_double_4_suite::test_same()",&local_80,&local_78);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,1.0);
  local_78 = local_78 & 0xffffffffffffff00;
  local_80._0_1_ = (value_type)local_70.member.window.super_span<double,_4UL>.member.size == 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xec,"void mean_double_4_suite::test_same()",&local_80,&local_78);
  local_80 = (value_type)
             CONCAT71(local_80._1_7_,
                      (value_type)local_70.member.window.super_span<double,_4UL>.member.size ==
                      1.97626258336499e-323);
  local_78 = CONCAT71(local_78._1_7_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","true",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xed,"void mean_double_4_suite::test_same()",&local_80,&local_78);
  local_80 = (value_type)local_70.member.window.super_span<double,_4UL>.member.size;
  local_78 = CONCAT44(local_78._4_4_,4);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xee,"void mean_double_4_suite::test_same()",&local_80,&local_78);
  local_80 = local_70.member.mean;
  local_78 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xef,"void mean_double_4_suite::test_same()",&local_80,&local_78);
  return;
}

Assistant:

void test_same()
{
    window::moment<double, 4> filter;
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 2);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 3);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 4);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.empty(), false);
    TRIAL_TEST_EQ(filter.full(), true);
    TRIAL_TEST_EQ(filter.size(), 4);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
}